

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestCase
               (ostream *stream,TestCase *test_case)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer piVar3;
  ostream *poVar4;
  pointer ppTVar5;
  pointer ppTVar6;
  TimeInMillis ms;
  TestResult *extraout_RDX;
  TestResult *extraout_RDX_00;
  TestResult *extraout_RDX_01;
  TestResult *result;
  long lVar7;
  TestInfo *test_info;
  uint uVar8;
  long lVar9;
  string kTestsuite;
  string local_90;
  string local_70;
  int local_4c;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"testsuite","");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  <",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_48._M_dataplus._M_p,local_48._M_string_length);
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"name","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,(test_case->name_)._M_dataplus._M_p,(allocator<char> *)&local_4c);
  OutputXmlAttribute(stream,&local_48,&local_90,&local_70);
  paVar2 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"tests","");
  local_4c = 0;
  for (ppTVar5 = (test_case->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar5 !=
      (test_case->test_info_list_).
      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar5 = ppTVar5 + 1) {
    local_4c = local_4c + (uint)(*ppTVar5)->matches_filter_;
  }
  StreamableToString<int>(&local_70,&local_4c);
  OutputXmlAttribute(stream,&local_48,&local_90,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"failures","");
  local_4c = TestCase::failed_test_count(test_case);
  StreamableToString<int>(&local_70,&local_4c);
  OutputXmlAttribute(stream,&local_48,&local_90,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"disabled","");
  local_4c = 0;
  for (ppTVar5 = (test_case->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar5 !=
      (test_case->test_info_list_).
      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar5 = ppTVar5 + 1) {
    uVar8 = 0;
    if ((*ppTVar5)->matches_filter_ == true) {
      uVar8 = (uint)(*ppTVar5)->is_disabled_;
    }
    local_4c = local_4c + uVar8;
  }
  StreamableToString<int>(&local_70,&local_4c);
  OutputXmlAttribute(stream,&local_48,&local_90,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"errors","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"0","");
  OutputXmlAttribute(stream,&local_48,&local_90,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"time","");
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_70,(internal *)test_case->elapsed_time_,ms);
  OutputXmlAttribute(stream,&local_48,&local_90,&local_70);
  result = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    result = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    result = extraout_RDX_01;
  }
  TestPropertiesAsXmlAttributes_abi_cxx11_
            (&local_90,(XmlUnitTestResultPrinter *)&test_case->ad_hoc_test_result_,result);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,">\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  ppTVar5 = (test_case->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar6 = (test_case->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppTVar6 - (long)ppTVar5) >> 3)) {
    lVar9 = 0;
    do {
      piVar3 = (test_case->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((lVar9 < (int)((ulong)((long)(test_case->test_indices_).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)piVar3) >> 2)) &&
         (lVar7 = (long)piVar3[lVar9], -1 < lVar7)) {
        if (ppTVar5[lVar7]->matches_filter_ != false) {
          test_info = ppTVar5[lVar7];
LAB_00118f7a:
          OutputXmlTestInfo(stream,(test_case->name_)._M_dataplus._M_p,test_info);
          ppTVar5 = (test_case->test_info_list_).
                    super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppTVar6 = (test_case->test_info_list_).
                    super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
      }
      else if (DAT_0000005a != '\0') {
        test_info = (TestInfo *)0x0;
        goto LAB_00118f7a;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (int)((ulong)((long)ppTVar6 - (long)ppTVar5) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  </",4);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,">\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestCase(std::ostream* stream,
                                                const TestCase& test_case) {
  const std::string kTestsuite = "testsuite";
  *stream << "  <" << kTestsuite;
  OutputXmlAttribute(stream, kTestsuite, "name", test_case.name());
  OutputXmlAttribute(stream, kTestsuite, "tests",
                     StreamableToString(test_case.reportable_test_count()));
  OutputXmlAttribute(stream, kTestsuite, "failures",
                     StreamableToString(test_case.failed_test_count()));
  OutputXmlAttribute(
      stream, kTestsuite, "disabled",
      StreamableToString(test_case.reportable_disabled_test_count()));
  OutputXmlAttribute(stream, kTestsuite, "errors", "0");
  OutputXmlAttribute(stream, kTestsuite, "time",
                     FormatTimeInMillisAsSeconds(test_case.elapsed_time()));
  *stream << TestPropertiesAsXmlAttributes(test_case.ad_hoc_test_result())
          << ">\n";

  for (int i = 0; i < test_case.total_test_count(); ++i) {
    if (test_case.GetTestInfo(i)->is_reportable())
      OutputXmlTestInfo(stream, test_case.name(), *test_case.GetTestInfo(i));
  }
  *stream << "  </" << kTestsuite << ">\n";
}